

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O0

void inssort_cache_block<8u>(Cacheblock<8U>_conflict *cache,int n)

{
  int iVar1;
  Cmp local_39;
  undefined1 local_38 [8];
  Cacheblock<8U>_conflict tmp;
  Cacheblock<8U>_conflict *pj;
  Cacheblock<8U>_conflict *pi;
  int n_local;
  Cacheblock<8U>_conflict *cache_local;
  
  pj = cache + 1;
  pi._4_4_ = n;
  while (pi._4_4_ = pi._4_4_ + -1, 0 < pi._4_4_) {
    local_38 = (undefined1  [8])pj->cached_bytes;
    tmp.cached_bytes = (uint64_t)pj->ptr;
    tmp.ptr = (uchar *)pj;
    while ((cache < tmp.ptr &&
           (iVar1 = Cmp::operator()(&local_39,(Cacheblock<8U>_conflict *)(tmp.ptr + -0x10),
                                    (Cacheblock<8U>_conflict *)local_38), 0 < iVar1))) {
      *(undefined8 *)tmp.ptr = *(undefined8 *)(tmp.ptr + -0x10);
      *(undefined8 *)(tmp.ptr + 8) = *(undefined8 *)(tmp.ptr + -8);
      tmp.ptr = tmp.ptr + -0x10;
    }
    *(undefined1 (*) [8])tmp.ptr = local_38;
    *(uint64_t *)(tmp.ptr + 8) = tmp.cached_bytes;
    pj = pj + 1;
  }
  return;
}

Assistant:

static inline void
inssort_cache_block(Cacheblock<CachedChars>* cache, int n)
{
	Cacheblock<CachedChars> *pi, *pj;
	for (pi = cache + 1; --n > 0; ++pi) {
		Cacheblock<CachedChars> tmp = *pi;
		for (pj = pi; pj > cache; --pj) {
			if (Cmp()(*(pj-1), tmp) <= 0)
				break;
			*pj = *(pj-1);
		}
		*pj = tmp;
	}
}